

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall
ON_PerObjectMeshParameters::Write(ON_PerObjectMeshParameters *this,ON_BinaryArchive *binary_archive)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  bVar3 = false;
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(binary_archive,0x40008000,1,0);
  if (bVar1) {
    bVar2 = false;
    bVar1 = ON_BinaryArchive::BeginWrite3dmBigChunk(binary_archive,0x40008000,0);
    if (bVar1) {
      bVar1 = ON_MeshParameters::Write(&this->m_mp,binary_archive);
      bVar2 = ON_BinaryArchive::EndWrite3dmChunk(binary_archive);
      bVar2 = bVar2 && bVar1;
    }
    bVar3 = ON_BinaryArchive::EndWrite3dmChunk(binary_archive);
    bVar3 = (bool)(bVar3 & bVar2);
  }
  return bVar3;
}

Assistant:

bool ON_PerObjectMeshParameters::Write(ON_BinaryArchive& binary_archive) const
{
  if ( !binary_archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0) )
    return false;

  bool rc = false;
  for(;;)
  {
    if ( !binary_archive.BeginWrite3dmBigChunk(TCODE_ANONYMOUS_CHUNK,0) )
      break;
    bool mprc = m_mp.Write(binary_archive);
    if ( !binary_archive.EndWrite3dmChunk() )
      break;
    if ( !mprc )
      break;
    rc = true;
    break;
  }

  if ( !binary_archive.EndWrite3dmChunk() )
    rc = false;

  return rc;
}